

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::SortImports::buildGroupAST
          (SortImports *this,ImportElems *imports,AST *body,Fodder *groupOpenFodder)

{
  pointer pIVar1;
  Allocator *this_00;
  ulong uVar2;
  Local *pLVar3;
  uint uVar4;
  Fodder *__x;
  initializer_list<jsonnet::internal::Local::Bind> __l;
  allocator_type local_179;
  AST *body_local;
  SortImports *local_170;
  ImportElems *local_168;
  Fodder *local_160;
  Fodder fodder;
  LocationRange local_138;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_f8;
  Bind local_e0;
  
  uVar2 = ((long)(imports->
                 super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(imports->
                super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0xe8 & 0xffffffff;
  body_local = body;
  local_170 = this;
  local_168 = imports;
  local_160 = groupOpenFodder;
  while( true ) {
    uVar4 = (uint)(uVar2 - 1);
    if ((int)uVar4 < 0) break;
    pIVar1 = (local_168->
             super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             )._M_impl.super__Vector_impl_data._M_start;
    fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = &pIVar1[(int)uVar2 - 2].adjacentFodder;
    if ((int)uVar2 == 1) {
      __x = local_160;
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::operator=(&fodder,__x);
    this_00 = local_170->alloc;
    local_138.file._M_dataplus._M_p = (pointer)&local_138.file.field_2;
    local_138.file._M_string_length = 0;
    local_138.file.field_2._M_local_buf[0] = '\0';
    local_138.end.line = 0;
    local_138.end.column = 0;
    local_138.begin.line = 0;
    local_138.begin.column = 0;
    Local::Bind::Bind(&local_e0,&pIVar1[uVar4 & 0x7fffffff].bind);
    __l._M_len = 1;
    __l._M_array = &local_e0;
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    vector(&local_f8,__l,&local_179);
    pLVar3 = Allocator::
             make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                       (this_00,&local_138,&fodder,&local_f8,&body_local);
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&local_f8);
    Local::Bind::~Bind(&local_e0);
    std::__cxx11::string::~string((string *)&local_138);
    body_local = &pLVar3->super_AST;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&fodder);
    uVar2 = uVar2 - 1;
  }
  return body_local;
}

Assistant:

AST *buildGroupAST(ImportElems &imports, AST *body, const Fodder &groupOpenFodder)
    {
        for (int i = imports.size() - 1; i >= 0; --i) {
            auto &import = imports[i];
            Fodder fodder;
            if (i == 0) {
                fodder = groupOpenFodder;
            } else {
                fodder = imports[i - 1].adjacentFodder;
            }
            auto *local =
                alloc.make<Local>(LocationRange(), fodder, Local::Binds({import.bind}), body);
            body = local;
        }

        return body;
    }